

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rfft2dTestML.c
# Opt level: O1

void main(void)

{
  int iVar1;
  long lVar2;
  long M2;
  float *data;
  FILE *pFVar3;
  long lVar4;
  char *__s;
  long lVar5;
  FILE *__s_00;
  float fVar6;
  double dVar7;
  double dVar8;
  double dVar9;
  long N;
  long N2;
  long local_40;
  long local_38;
  
  local_38 = 0x40;
  local_40 = 0x100;
  printf(" %zu  Byte Floats \n",4);
  printf(" randseed = %10u\n",0x309);
  srand(0x309);
  lVar2 = lround(8.0);
  lVar5 = 1L << ((byte)lVar2 & 0x3f);
  local_40 = lVar5;
  M2 = lround(5.999999999999999);
  lVar4 = 1L << ((byte)M2 & 0x3f);
  local_38 = lVar4;
  printf("fft size = %6ld X%6ld,  ",lVar4,lVar5);
  iVar1 = fft2dInit(M2,lVar2);
  __s_00 = (FILE *)(long)iVar1;
  data = (float *)malloc((lVar4 << ((byte)lVar2 & 0x3f)) << 2);
  pFVar3 = (FILE *)0x2;
  if (data != (float *)0x0) {
    pFVar3 = __s_00;
  }
  if (pFVar3 == (FILE *)0x0) {
    __s_00 = fopen("fftdat.dr2","wb");
    pFVar3 = (FILE *)0xffffffffffffffce;
    if (__s_00 != (FILE *)0x0) {
      pFVar3 = (FILE *)0x0;
    }
  }
  if (pFVar3 == (FILE *)0x2) {
    __s = " out of memory ";
  }
  else {
    if (pFVar3 == (FILE *)0x0) {
      fwrite(&local_40,8,1,__s_00);
      fwrite(&local_38,8,1,__s_00);
      lVar4 = local_40 * local_38;
      if (0 < lVar4) {
        lVar5 = 0;
        do {
          iVar1 = rand();
          data[lVar5] = (float)iVar1 * 9.313226e-10 + -1.0;
          lVar5 = lVar5 + 1;
        } while (lVar4 - lVar5 != 0);
      }
      fwrite(data,lVar4 * 4,1,__s_00);
      rfft2d(data,M2,lVar2);
      fwrite(data,lVar4 * 4,1,__s_00);
      fclose(__s_00);
      rifft2d(data,M2,lVar2);
      srand(0x309);
      if (lVar4 < 1) {
        dVar8 = 0.0;
      }
      else {
        fVar6 = 0.0;
        lVar2 = 0;
        do {
          iVar1 = rand();
          dVar7 = (double)fVar6;
          dVar9 = ABS(((double)iVar1 * 9.313225746154785e-10 + -1.0) - (double)data[lVar2]);
          dVar8 = dVar9;
          if (dVar9 <= dVar7) {
            dVar8 = dVar7;
          }
          fVar6 = (float)(double)(~-(ulong)NAN(dVar7) & (ulong)dVar8 |
                                 -(ulong)NAN(dVar7) & (ulong)dVar9);
          lVar2 = lVar2 + 1;
        } while (lVar4 - lVar2 != 0);
        dVar8 = (double)fVar6;
      }
      printf("maxerr rfft = %6.4e\n",dVar8);
      free(data);
      goto LAB_0010146d;
    }
    __s = " error ";
  }
  puts(__s);
LAB_0010146d:
  fft2dFree();
  puts(" Done. ");
  return;
}

Assistant:

void main(){
long 	N2 = 64;	/* the number of rows in 2d ffts, must be power of 2 */
long 	N = 256;	/* the number of cols in 2d ffts, must be power of 2 */
float	*a;
float	maxerrfft;
long 	i1;
long 	TheErr;
long		M;
long		M2;

FILE *fdataout;				/* output file */

unsigned int	randseed = 777;
int		rannum;
#if macintosh
	UnsignedWide 		TheTime1;
	Microseconds(&TheTime1);
	randseed = TheTime1.lo;
#endif

printf(" %zu  Byte Floats \n", sizeof(a[0]));
printf(" randseed = %10u\n", randseed);

srand(randseed);
M = lround(LOG2(N));
N = POW2(M);
M2 = lround(LOG2(N2));
N2 = POW2(M2);

printf("fft size = %6ld X%6ld,  ", N2, N);

TheErr = 0;

if(!TheErr){
	TheErr = fft2dInit(M2, M);
}

a = (float *) malloc(N2*N*sizeof(float) );
if (a == 0) TheErr = 2;
if(!TheErr){
	fdataout = fopen("fftdat.dr2", "wb");
	if (fdataout == NULL) TheErr = -50;
}
if(!TheErr){

		/*  write sizes to fdataout */
	fwrite(&N, sizeof(N), 1, fdataout);
	fwrite(&N2, sizeof(N2), 1, fdataout);
		/*  set up a simple test case and write to fdataout */
	for (i1=0; i1<N2*N; i1++){
		rannum = rand();
		a[i1] = BIPRAND(rannum);
	}
	fwrite(a, N2*N*sizeof(float), 1, fdataout);

	/* real, 2d fast fourier transform */
	rfft2d(a, M2, M);

	/* write out answer */
	fwrite(a, N2*N*sizeof(float), 1, fdataout);
	fclose(fdataout);

	/* compute and check inverse transform */
	rifft2d(a, M2, M);

	maxerrfft = 0;
	srand(randseed);
	for (i1=0; i1<N2*N; i1++){
		rannum = rand();
		maxerrfft = fmax(maxerrfft, fabs(BIPRAND(rannum)-a[i1]));
	}

	printf("maxerr rfft = %6.4e\n", maxerrfft);

	free(a);
	fft2dFree();
}
else{
	if(TheErr==2)	printf(" out of memory \n");
	else	printf(" error \n");
	fft2dFree();
}
printf(" Done. \n");
return;
}